

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ExpressionFilter::Copy(ExpressionFilter *this)

{
  _func_int **pp_Var1;
  pointer pEVar2;
  long in_RSI;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  _func_int **local_18;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(in_RSI + 0x10));
  (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_20,pEVar2);
  make_uniq<duckdb::ExpressionFilter,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((duckdb *)&local_18,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  pp_Var1 = local_18;
  local_18 = (_func_int **)0x0;
  (this->super_TableFilter)._vptr_TableFilter = pp_Var1;
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ExpressionFilter::Copy() const {
	return make_uniq<ExpressionFilter>(expr->Copy());
}